

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitExtKR_ParameterDeclaration
          (SyntaxDumper *this,ExtKR_ParameterDeclarationSyntax *node)

{
  long lVar1;
  ExtKR_ParameterDeclarationSyntax *pEVar2;
  SyntaxToken aSStack_58 [56];
  
  pEVar2 = node + 0x28;
  while (lVar1 = *(long *)pEVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    pEVar2 = (ExtKR_ParameterDeclarationSyntax *)(lVar1 + 0x10);
  }
  pEVar2 = node + 0x30;
  while (lVar1 = *(long *)pEVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,aSStack_58,node);
    psy::C::SyntaxToken::~SyntaxToken(aSStack_58);
    pEVar2 = (ExtKR_ParameterDeclarationSyntax *)(lVar1 + 0x10);
  }
  ExtKR_ParameterDeclarationSyntax::semicolonToken((ExtKR_ParameterDeclarationSyntax *)aSStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aSStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken(aSStack_58);
  return Skip;
}

Assistant:

virtual Action visitExtKR_ParameterDeclaration(const ExtKR_ParameterDeclarationSyntax* node) override
    {
        for (auto iter = node->specifiers(); iter; iter = iter->next)
            nonterminal(iter->value);
        for (auto iter = node->declarators(); iter; iter = iter->next) {
            nonterminal(iter->value);
            terminal(iter->delimiterToken(), node);
        }
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }